

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O1

void nn_btcp_destroy(void *self)

{
  if (*(int *)((long)self + 0x80) == 1) {
    nn_list_term((nn_list *)((long)self + 0x2f8));
    if (*(long *)((long)self + 0x2f0) == 0) {
      nn_usock_term((nn_usock *)((long)self + 0x90));
      nn_fsm_term((nn_fsm *)self);
      nn_free(self);
      return;
    }
  }
  else {
    nn_btcp_destroy_cold_1();
  }
  nn_btcp_destroy_cold_2();
}

Assistant:

static void nn_btcp_destroy (void *self)
{
    struct nn_btcp *btcp = self;

    nn_assert_state (btcp, NN_BTCP_STATE_IDLE);
    nn_list_term (&btcp->atcps);
    nn_assert (btcp->atcp == NULL);
    nn_usock_term (&btcp->usock);
    nn_fsm_term (&btcp->fsm);

    nn_free (btcp);
}